

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void lodepng_color_mode_init(LodePNGColorMode *info)

{
  info->key_defined = 0;
  info->key_r = 0;
  info->key_g = 0;
  info->key_b = 0;
  info->colortype = LCT_RGBA;
  info->bitdepth = 8;
  info->palette = (uchar *)0x0;
  info->palettesize = 0;
  return;
}

Assistant:

void lodepng_color_mode_init(LodePNGColorMode* info)
{
	info->key_defined = 0;
	info->key_r = info->key_g = info->key_b = 0;
	info->colortype = LCT_RGBA;
	info->bitdepth = 8;
	info->palette = 0;
	info->palettesize = 0;
}